

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WriteExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,OASIS_FLOAT cum_weight_constant,int epcalc,int eptype,int eptype_tvar,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting,int samplesize)

{
  double dVar1;
  pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> *this_00;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference ppVar5;
  reference plVar6;
  mapped_type *this_01;
  pointer ppVar7;
  double dVar8;
  long *plVar9;
  _Base_ptr current_return_period;
  float fVar10;
  code *local_1b8;
  _Self local_168;
  double local_160;
  double retperiod_1;
  iterator iter;
  double retperiod;
  lossval lp;
  iterator __end2;
  iterator __begin2;
  lossvec2 *__range2;
  double dStack_f0;
  bool largest_loss;
  double max_retperiod;
  double cumulative_weighting;
  float local_d8;
  int i;
  OASIS_FLOAT tvar;
  OASIS_FLOAT last_computed_loss;
  double last_computed_rp;
  size_t nextreturnperiodindex;
  pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> *local_b0;
  lossvec2 *lpv;
  undefined1 local_98 [8];
  pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> s;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  *__range1;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  int eptype_tvar_local;
  int eptype_local;
  int epcalc_local;
  OASIS_FLOAT cum_weight_constant_local;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  *items_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  tail._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = eptype_tvar;
  tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype;
  sVar4 = std::
          map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          ::size(items);
  if ((sVar4 != 0) && (samplesize != 0)) {
    std::
    map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::map((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
           *)&__range1);
    __end1 = std::
             map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
             ::begin(items);
    s.second.super__Vector_base<lossval,_std::allocator<lossval>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                  ::end(items);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&s.second.
                                                  super__Vector_base<lossval,_std::allocator<lossval>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  ), bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>
               ::operator*(&__end1);
      std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>::pair
                ((pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> *)local_98,ppVar5
                );
      local_b0 = &s;
      std::vector<lossval,_std::allocator<lossval>_>::rbegin
                ((vector<lossval,_std::allocator<lossval>_> *)&stack0xffffffffffffff48);
      std::vector<lossval,_std::allocator<lossval>_>::rend
                ((vector<lossval,_std::allocator<lossval>_> *)&nextreturnperiodindex);
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<lossval*,std::vector<lossval,std::allocator<lossval>>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
                  *)&stack0xffffffffffffff48,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>_>
                  *)&nextreturnperiodindex);
      this_00 = local_b0;
      last_computed_rp = 0.0;
      _tvar = 0.0;
      i = 0;
      local_d8 = 0.0;
      cumulative_weighting._4_4_ = 1;
      max_retperiod = 0.0;
      dStack_f0 = 0.0;
      bVar2 = false;
      __end2 = std::vector<lossval,_std::allocator<lossval>_>::begin
                         ((vector<lossval,_std::allocator<lossval>_> *)local_b0);
      lp._16_8_ = std::vector<lossval,_std::allocator<lossval>_>::end
                            ((vector<lossval,_std::allocator<lossval>_> *)this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>
                                         *)&lp.value), bVar3) {
        plVar6 = __gnu_cxx::
                 __normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>::
                 operator*(&__end2);
        lp._0_8_ = plVar6->period_weighting;
        lp.period_weighting = *(double *)&plVar6->value;
        max_retperiod = (double)lp._0_8_ * (double)cum_weight_constant + max_retperiod;
        if (((double)lp._0_8_ != 0.0) || (NAN((double)lp._0_8_))) {
          current_return_period = (_Base_ptr)(1.0 / max_retperiod);
          if (!bVar2) {
            dStack_f0 = (double)current_return_period + 0.0001;
            bVar2 = true;
          }
          if ((this->useReturnPeriodFile_ & 1U) == 0) {
            fVar10 = (local_d8 - lp.period_weighting._0_4_ / (float)samplesize) /
                     (float)cumulative_weighting._4_4_;
            this_01 = std::
                      map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      ::operator[]((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                                    *)&__range1,(key_type *)local_98);
            iter._M_node = current_return_period;
            std::vector<TVaR,_std::allocator<TVaR>_>::push_back(this_01,(value_type *)&iter);
            if (this->WriteEPTOutput != 0 ||
                this->WriteEPTOutput != 0 && *(long *)&this->field_0x158 != 0) {
              local_1b8 = (code *)this->WriteEPTOutput;
              plVar9 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x158);
              if (((ulong)local_1b8 & 1) != 0) {
                local_1b8 = *(code **)(local_1b8 + *plVar9 + -1);
              }
              (*local_1b8)(current_return_period,lp.period_weighting._0_4_ / (float)samplesize,
                           plVar9,fileIDs,local_98._0_4_,epcalc,
                           tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
            }
          }
          else {
            WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                      (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,(OASIS_FLOAT *)&i,
                       (double)current_return_period,lp.period_weighting._0_4_ / (float)samplesize,
                       local_98._0_4_,tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                       epcalc,dStack_f0,cumulative_weighting._4_4_,local_d8,
                       (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                        *)&__range1,this->WriteEPTOutput,
                       *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                         **)&this->field_0x158);
            fVar10 = (local_d8 - lp.period_weighting._0_4_ / (float)samplesize) /
                     (float)cumulative_weighting._4_4_;
          }
          local_d8 = local_d8 - fVar10;
          cumulative_weighting._4_4_ = cumulative_weighting._4_4_ + 1;
        }
        __gnu_cxx::__normal_iterator<lossval_*,_std::vector<lossval,_std::allocator<lossval>_>_>::
        operator++(&__end2);
      }
      if ((this->useReturnPeriodFile_ & 1U) != 0) {
        retperiod_1 = (double)std::
                              map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              ::begin(unusedperiodstoweighting);
        do {
          local_160 = 0.0;
          local_168._M_node =
               (_Base_ptr)
               std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::end(unusedperiodstoweighting);
          bVar2 = std::operator!=((_Self *)&retperiod_1,&local_168);
          if (bVar2) {
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)&retperiod_1);
            max_retperiod = ppVar7->second * (double)cum_weight_constant + max_retperiod;
            local_160 = 1.0 / max_retperiod;
            std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)&retperiod_1);
          }
          WriteReturnPeriodOut<std::map<int,std::vector<TVaR,std::allocator<TVaR>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,(size_t *)&last_computed_rp,(double *)&tvar,(OASIS_FLOAT *)&i,
                     local_160,0.0,local_98._0_4_,
                     tail._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,epcalc,dStack_f0,
                     cumulative_weighting._4_4_,local_d8,
                     (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                      *)&__range1,this->WriteEPTOutput,
                     *(map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                       **)&this->field_0x158);
          dVar1 = last_computed_rp;
          local_d8 = local_d8 - local_d8 / (float)cumulative_weighting._4_4_;
          cumulative_weighting._4_4_ = cumulative_weighting._4_4_ + 1;
          dVar8 = (double)std::vector<int,_std::allocator<int>_>::size(&this->returnperiods_);
        } while ((ulong)dVar1 < (ulong)dVar8);
      }
      std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>::~pair
                ((pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_> *)local_98);
      std::_Rb_tree_iterator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>
      ::operator++(&__end1);
    }
    if (((this->ordFlag_ & 1U) != 0) && (*this->fout_ != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,epcalc,(int)tail._M_t._M_impl.super__Rb_tree_header._M_node_count,
                (map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                 *)&__range1);
    }
    std::
    map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~map((map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            *)&__range1);
  }
  return;
}

Assistant:

void aggreports::WriteExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<int, lossvec2> &items,
	const OASIS_FLOAT cum_weight_constant,
	int epcalc, int eptype, int eptype_tvar,
	std::map<int, double> &unusedperiodstoweighting, int samplesize) {

  if (items.size() == 0) return;
  if (samplesize == 0) return;

#ifdef ORD_OUTPUT
  if (os_ept_exists_ == false) {
  	if (parquetFileNames_[EPT] != "") {
		os_ept_ = GetParquetStreamWriter(EPT);
		os_ept_exists_ = true;
	}
  }
#endif

  std::map<int, std::vector<TVaR>> tail;

  for (auto s : items) {
    lossvec2 &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;
    double cumulative_weighting = 0;
    double max_retperiod = 0;
    bool largest_loss = false;

    for (auto lp : lpv) {
      cumulative_weighting += (lp.period_weighting * cum_weight_constant);

      if (lp.period_weighting) {
	double retperiod = 1 / cumulative_weighting;

	if (!largest_loss) {
	  max_retperiod = retperiod + 0.0001;   // Add for floating point errors
	  largest_loss = true;
	}

	if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value / samplesize, s.first, eptype, epcalc,
			       max_retperiod, i, tvar, tail, WriteEPTOutput,
			       os_ept_);
#else
	  WriteReturnPeriodOut(fileIDs, nextreturnperiodindex,
			       last_computed_rp, last_computed_loss, retperiod,
			       lp.value / samplesize, s.first, eptype, epcalc,
			       max_retperiod, i, tvar, tail, WriteEPTOutput);
#endif
	  tvar = tvar - ((tvar - (lp.value / samplesize)) / i);
	} else {
	  tvar = tvar - ((tvar - (lp.value / samplesize)) / i);
	  tail[s.first].push_back({retperiod, tvar});
	  if (WriteEPTOutput != nullptr) {
	    (this->*WriteEPTOutput)(fileIDs, s.first, epcalc, eptype, retperiod,
				    lp.value / samplesize);
	  }
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	  if (parquetFileNames_[EPT] != "") {
	    WriteParquetOutput(os_ept_, s.first, epcalc, eptype, retperiod,
			       lp.value / samplesize);
	  }
#endif
	}
	i++;
      }
    }
    if (useReturnPeriodFile_) {
      auto iter = unusedperiodstoweighting.begin();
      do {
	double retperiod = 0;
	if (iter != unusedperiodstoweighting.end()) {
	  cumulative_weighting += (iter->second * cum_weight_constant);
	  retperiod = 1 / cumulative_weighting;
	  ++iter;
	}
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput, os_ept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0, s.first, eptype,
			     epcalc, max_retperiod, i, tvar, tail,
			     WriteEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[EPT] != nullptr) WriteTVaR(fileIDs, epcalc, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[EPT] != "") {
    WriteTVaR(os_ept_, epcalc, eptype_tvar, tail);
  }
#endif

}